

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode JsVarSerializerDetachArrayBuffer(JsVarSerializerHandle serializerHandle)

{
  JsVarSerializerHandle local_18;
  JsVarSerializerHandle serializerHandle_local;
  
  if (serializerHandle == (JsVarSerializerHandle)0x0) {
    serializerHandle_local._4_4_ = JsErrorNullArgument;
  }
  else {
    local_18 = serializerHandle;
    serializerHandle_local._4_4_ =
         ContextAPINoScriptWrapper_NoRecord<JsVarSerializerDetachArrayBuffer::__0>
                   ((anon_class_8_1_f64130d8)&local_18,false,false);
  }
  return serializerHandle_local._4_4_;
}

Assistant:

CHAKRA_API
JsVarSerializerDetachArrayBuffer(_In_ JsVarSerializerHandle serializerHandle)
{
    PARAM_NOT_NULL(serializerHandle);
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        ChakraCoreStreamWriter* streamWriter = reinterpret_cast<ChakraCoreStreamWriter*>(serializerHandle);
        if (!streamWriter->DetachArrayBuffer())
        {
            return JsErrorInvalidArgument;
        }
        return JsNoError;
    });
}